

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClientSession.cpp
# Opt level: O3

void __thiscall ki::protocol::net::ClientSession::on_control_message(ClientSession *this)

{
  PacketHeader *in_RSI;
  
  on_control_message((ClientSession *)
                     ((long)&this->_vptr_ClientSession + (long)this->_vptr_ClientSession[-6]),in_RSI
                    );
  return;
}

Assistant:

void ClientSession::on_control_message(const PacketHeader& header)
	{
		switch ((control::Opcode)header.get_opcode())
		{
		case control::Opcode::SESSION_OFFER:
			on_session_offer();
			break;

		case control::Opcode::KEEP_ALIVE:
			on_keep_alive();
			break;

		case control::Opcode::KEEP_ALIVE_RSP:
			on_keep_alive_response();
			break;

		default:
			close(SessionCloseErrorCode::UNHANDLED_CONTROL_MESSAGE);
			break;
		}
	}